

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransArray.cc
# Opt level: O0

void __thiscall TransArray::~TransArray(TransArray *this)

{
  TransArray *this_local;
  
  std::vector<int,_std::allocator<int>_>::clear(&this->theArray);
  std::vector<long,_std::allocator<long>_>::clear(&this->offset);
  std::vector<long,_std::allocator<long>_>::~vector(&this->offset);
  std::vector<int,_std::allocator<int>_>::~vector(&this->theArray);
  return;
}

Assistant:

TransArray::~TransArray() {
    theArray.clear();
    offset.clear();
}